

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpPackedVarintT<true,unsigned_int,(unsigned_short)0>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  anon_class_48_6_e660b55a add;
  uint32_t uVar2;
  FieldEntry *pFVar3;
  void *x;
  RepeatedField<unsigned_int> *pRVar4;
  FieldAux *pFVar5;
  anon_class_16_2_03b7c46c add_00;
  undefined6 uStack_ae;
  FieldAux aux;
  RepeatedField<unsigned_int> *field;
  void *base;
  bool is_validated_enum;
  bool is_zigzag;
  uint16_t xform_val;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  
  msg_local = (MessageLite *)data.field_0;
  uVar2 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  pFVar3 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar2);
  uVar1 = pFVar3->type_card;
  x = MaybeGetSplitBase(msg,true,table);
  pRVar4 = MaybeCreateRepeatedFieldRefAt<unsigned_int,true>(x,(ulong)pFVar3->offset,msg);
  if ((uVar1 & 0x400) == 0) {
    add_00.is_zigzag = (uVar1 & 0x600) == 0x200;
    add_00.field = pRVar4;
    add_00._9_7_ = 0;
    data_local.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)
         EpsCopyInputStream::
         ReadPackedVarint<google::protobuf::internal::TcParser::MpPackedVarintT<true,unsigned_int,(unsigned_short)0>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(unsigned_long)_1_>
                   (&ctx->super_EpsCopyInputStream,ptr,add_00);
  }
  else {
    pFVar5 = TcParseTableBase::field_aux(table,(uint)pFVar3->aux_idx);
    add.aux.message_default_p = pFVar5->message_default_p;
    add._0_8_ = CONCAT62(uStack_ae,uVar1) & 0xffffffffffff0600;
    add.msg = msg;
    add.table = table;
    add.data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
    add.field = pRVar4;
    data_local.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)
         EpsCopyInputStream::
         ReadPackedVarint<google::protobuf::internal::TcParser::MpPackedVarintT<true,unsigned_int,(unsigned_short)0>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_>
                   (&ctx->super_EpsCopyInputStream,ptr,add);
  }
  return (char *)data_local.field_0.data;
}

Assistant:

const char* TcParser::MpPackedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto* field = &MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  if (is_validated_enum) {
    const TcParseTableBase::FieldAux aux = *table->field_aux(entry.aux_idx);
    PrefetchEnumData(xform_val, aux);
    return ctx->ReadPackedVarint(ptr, [=](int32_t value) {
      if (!EnumIsValidAux(value, xform_val, aux)) {
        AddUnknownEnum(msg, table, data.tag(), value);
      } else {
        field->Add(value);
      }
    });
  } else {
    return ctx->ReadPackedVarint(ptr, [=](uint64_t value) {
      field->Add(is_zigzag ? (sizeof(FieldType) == 8
                                  ? WireFormatLite::ZigZagDecode64(value)
                                  : WireFormatLite::ZigZagDecode32(
                                        static_cast<uint32_t>(value)))
                           : value);
    });
  }
}